

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O2

int GetNMEASentenceublox(UBLOX *publox,NMEADATA *pNMEAData)

{
  int iVar1;
  int iVar2;
  double dVar3;
  int local_10a8;
  char talkerid [3];
  int sentencelen;
  int nbBytesDiscarded;
  char mnemonic [6];
  char *ptr;
  NMEADATA *local_1088;
  CHRONO chrono;
  char recvbuf [4096];
  
  nbBytesDiscarded = 0;
  ptr = (char *)0x0;
  sentencelen = 0;
  StartChrono(&chrono);
  memset(recvbuf,0,0x1000);
  local_10a8 = 3;
  iVar1 = ReadAllRS232Port(&publox->RS232Port,(uint8 *)recvbuf,3);
  if (iVar1 == 0) {
    local_1088 = pNMEAData;
    if ((publox->bSaveRawData != 0) && ((FILE *)publox->pfSaveFile != (FILE *)0x0)) {
      fwrite(recvbuf,3,1,(FILE *)publox->pfSaveFile);
      fflush((FILE *)publox->pfSaveFile);
    }
    iVar1 = 3;
    do {
      talkerid[0] = '\0';
      talkerid[1] = '\0';
      mnemonic[0] = '\0';
      mnemonic[1] = '\0';
      mnemonic[2] = '\0';
      mnemonic[3] = '\0';
      talkerid[2] = '\0';
      mnemonic[4] = '\0';
      mnemonic[5] = '\0';
      iVar2 = FindSentenceNMEA(recvbuf,iVar1,talkerid,mnemonic,&sentencelen,&local_10a8,&ptr,
                               &nbBytesDiscarded);
      if (iVar2 == 1) {
        local_10a8 = 3;
        if (nbBytesDiscarded < 3) {
          local_10a8 = nbBytesDiscarded;
        }
      }
      else if (iVar2 == 0) {
        if (0 < iVar1 - (nbBytesDiscarded + sentencelen)) {
          puts("Warning getting data from a ublox : Unexpected data after a sentence. ");
        }
        iVar1 = ProcessSentenceNMEA(ptr,sentencelen,talkerid,mnemonic,local_1088);
        return (uint)(iVar1 != 0);
      }
      iVar2 = local_10a8;
      iVar1 = iVar1 - nbBytesDiscarded;
      memmove(recvbuf,recvbuf + nbBytesDiscarded,(long)iVar1);
      if (0xfff < iVar2 + iVar1) {
        puts("Error reading data from a ublox : Invalid data. ");
        return 4;
      }
      iVar2 = ReadAllRS232Port(&publox->RS232Port,(uint8 *)(recvbuf + iVar1),iVar2);
      if (iVar2 != 0) goto LAB_001154e5;
      if ((publox->bSaveRawData != 0) && ((FILE *)publox->pfSaveFile != (FILE *)0x0)) {
        fwrite(recvbuf + iVar1,(long)local_10a8,1,(FILE *)publox->pfSaveFile);
        fflush((FILE *)publox->pfSaveFile);
      }
      iVar1 = iVar1 + local_10a8;
      dVar3 = GetTimeElapsedChronoQuick(&chrono);
    } while (dVar3 <= 4.0);
    puts("Error reading data from a ublox : Sentence timeout. ");
    iVar1 = 2;
  }
  else {
LAB_001154e5:
    puts("Error reading data from a ublox. ");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int GetNMEASentenceublox(UBLOX* publox, NMEADATA* pNMEAData)
{
	char recvbuf[MAX_NB_BYTES_UBLOX];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	char* ptr = NULL;
	int sentencelen = 0;
	char talkerid[MAX_NB_BYTES_TALKER_ID_NMEA+1]; // +1 for the null terminator character for strings.
	char mnemonic[MAX_NB_BYTES_MNEMONIC_NMEA+1]; // +1 for the null terminator character for strings.
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_UBLOX-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired message...

	nbBytesToRequest = MIN_NB_BYTES_SENTENCE_NMEA;
	if (ReadAllRS232Port(&publox->RS232Port, (uint8*)recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a ublox. \n");
		return EXIT_FAILURE;
	}
	if ((publox->bSaveRawData)&&(publox->pfSaveFile))
	{
		fwrite(recvbuf, nbBytesToRequest, 1, publox->pfSaveFile);
		fflush(publox->pfSaveFile);
	}
	BytesReceived += nbBytesToRequest;
	
	for (;;)
	{
		memset(talkerid, 0, sizeof(talkerid));
		memset(mnemonic, 0, sizeof(mnemonic));
		res = FindSentenceNMEA(recvbuf, BytesReceived, talkerid, mnemonic, &sentencelen, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(MIN_NB_BYTES_SENTENCE_NMEA, nbBytesDiscarded);
		}	
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a ublox : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&publox->RS232Port, (uint8*)recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a ublox. \n");
			return EXIT_FAILURE;
		}
		if ((publox->bSaveRawData)&&(publox->pfSaveFile))
		{
			fwrite(recvbuf+BytesReceived, nbBytesToRequest, 1, publox->pfSaveFile);
			fflush(publox->pfSaveFile);
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_UBLOX)
		{
			printf("Error reading data from a ublox : Sentence timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-sentencelen > 0)
	{
		printf("Warning getting data from a ublox : Unexpected data after a sentence. \n");
	}

	//// Get data bytes.

	//memset(databuf, 0, databuflen);

	//// Check the number of data bytes before copy.
	//if (databuflen < *psentencelen)
	//{
	//	printf("Error getting data from a ublox : Too small data buffer. \n");
	//	return EXIT_FAILURE;
	//}

	//// Copy the data bytes of the message.
	//if (*psentencelen > 0)
	//{
	//	memcpy(databuf, ptr, *psentencelen);
	//}

	if (ProcessSentenceNMEA(ptr, sentencelen, talkerid, mnemonic, pNMEAData) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}